

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslerror.cpp
# Opt level: O3

void __thiscall QSslError::QSslError(QSslError *this,SslError error)

{
  _Head_base<0UL,_QSslErrorPrivate_*,_false> _Var1;
  long in_FS_OFFSET;
  QByteArray local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl = (QSslErrorPrivate *)operator_new(0x10);
  (_Var1._M_head_impl)->error = NoError;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char *)0x0;
  local_48.d.size = 0;
  QSslCertificate::QSslCertificate(&(_Var1._M_head_impl)->certificate,&local_48,Pem);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
  (this->d)._M_t.super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>.
  _M_t.super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>.
  super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl = _Var1._M_head_impl;
  (_Var1._M_head_impl)->error = error;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSslError::QSslError(SslError error)
    : d(new QSslErrorPrivate)
{
    d->error = error;
}